

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kerning.cpp
# Opt level: O0

void dpfb::readLookupTable(Stream *stream,LookupContext *ctx)

{
  uint16_t uVar1;
  uint16_t uVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int64_t prevPos;
  uint16_t subTableOffset;
  uint16_t subTableCount;
  uint16_t lookupType;
  int64_t lookupTablePos;
  LookupContext *ctx_local;
  Stream *stream_local;
  
  iVar3 = (*stream->_vptr_Stream[8])();
  uVar1 = streams::Stream::readU16Be(stream);
  if ((uVar1 == 2) || (uVar1 == 9)) {
    (*stream->_vptr_Stream[7])(stream,2,1);
    prevPos._4_2_ = streams::Stream::readU16Be(stream);
    while (prevPos._4_2_ != 0) {
      uVar2 = streams::Stream::readU16Be(stream);
      iVar4 = (*stream->_vptr_Stream[8])();
      (*stream->_vptr_Stream[7])(stream,CONCAT44(extraout_var,iVar3) + (ulong)uVar2,0);
      readGposSubtable(stream,ctx,(uint)uVar1);
      (*stream->_vptr_Stream[7])(stream,CONCAT44(extraout_var_00,iVar4),0);
      prevPos._4_2_ = prevPos._4_2_ - 1;
    }
  }
  return;
}

Assistant:

static void readLookupTable(Stream& stream, LookupContext& ctx)
{
    const auto lookupTablePos = stream.getPosition();

    const auto lookupType = stream.readU16Be();
    if (lookupType != gposLookupPairAdjustment
            && lookupType != gposLookupExtension)
        return;

    // Skip lookupFlag
    stream.seek(sizeof(std::uint16_t), SeekOrigin::cur);

    auto subTableCount = stream.readU16Be();
    while (subTableCount--) {
        const auto subTableOffset = stream.readU16Be();
        const auto prevPos = stream.getPosition();

        stream.seek(
            lookupTablePos + subTableOffset, SeekOrigin::set);
        readGposSubtable(stream, ctx, lookupType);

        stream.seek(prevPos, SeekOrigin::set);
    }
}